

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  size_t sVar2;
  pointer pmVar3;
  run_result result_00;
  run_result result;
  char **argv_local;
  int argc_local;
  undefined4 extraout_var;
  
  argv_local._4_4_ = 0;
  sVar2 = testbench::machine::availability::count();
  if (sVar2 == 0) {
    fputs("Fatal error no machines implemented\n",_stderr);
    argv_local._4_4_ = 1;
  }
  else {
    process_arguments(argv);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&machine);
    if (!bVar1) {
      usage_exit(2);
    }
    if (trace_file != (FILE *)0x0) {
      pmVar3 = std::unique_ptr<testbench::machine,_std::default_delete<testbench::machine>_>::
               operator->(&machine);
      (*pmVar3->_vptr_machine[1])(pmVar3,trace_file);
    }
    pmVar3 = std::unique_ptr<testbench::machine,_std::default_delete<testbench::machine>_>::
             operator->(&machine);
    result_00.cycle_count._0_4_ = (**pmVar3->_vptr_machine)(pmVar3,_stdin,_stdout);
    result_00.cycle_count._4_4_ = extraout_var;
    if ((print_stats_on_exit & 1U) != 0) {
      print_run_result(result_00);
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    testbench::run_result result;

    if (testbench::machine::available.count() == 0) {   // forgot to link implementations?
        fputs("Fatal error no machines implemented\n", stderr);
        return 1;
    }
    process_arguments(argv);
    if (not machine) usage_exit(2);
    if (trace_file != nullptr) {
        machine->enable_trace(trace_file);
    }
    result = machine->run(stdin, stdout);
    if (print_stats_on_exit) {
        print_run_result(result);
    }
}